

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O0

void __thiscall
rapidjson::
GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
::GenericDocument(GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                  *this,GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                        *rhs)

{
  size_t sVar1;
  undefined4 uVar2;
  ParseResult local_28;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *local_18;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *rhs_local;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *this_local;
  
  local_18 = rhs;
  rhs_local = this;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  GenericValue(&this->
                super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ,&rhs->
                 super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              );
  this->allocator_ = local_18->allocator_;
  this->ownAllocator_ = local_18->ownAllocator_;
  internal::Stack<rapidjson::CrtAllocator>::Stack(&this->stack_,&local_18->stack_);
  uVar2 = *(undefined4 *)&(local_18->parseResult_).field_0x4;
  sVar1 = (local_18->parseResult_).offset_;
  (this->parseResult_).code_ = (local_18->parseResult_).code_;
  *(undefined4 *)&(this->parseResult_).field_0x4 = uVar2;
  (this->parseResult_).offset_ = sVar1;
  local_18->allocator_ = (MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0;
  local_18->ownAllocator_ = (MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0;
  ParseResult::ParseResult(&local_28);
  (local_18->parseResult_).code_ = local_28.code_;
  *(undefined4 *)&(local_18->parseResult_).field_0x4 = local_28._4_4_;
  (local_18->parseResult_).offset_ = local_28.offset_;
  return;
}

Assistant:

GenericDocument(GenericDocument&& rhs) RAPIDJSON_NOEXCEPT
        : ValueType(std::forward<ValueType>(rhs)), // explicit cast to avoid prohibited move from Document
          allocator_(rhs.allocator_),
          ownAllocator_(rhs.ownAllocator_),
          stack_(std::move(rhs.stack_)),
          parseResult_(rhs.parseResult_)
    {
        rhs.allocator_ = 0;
        rhs.ownAllocator_ = 0;
        rhs.parseResult_ = ParseResult();
    }